

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O2

void __thiscall logging_tests::logging_timer::test_method(logging_timer *this)

{
  long lVar1;
  string prefix;
  string end_msg;
  iterator pvVar2;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  undefined1 in_stack_fffffffffffffe78 [16];
  undefined8 in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea1;
  undefined8 in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  string_view result_prefix;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8 [32];
  string local_98 [32];
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> micro_timer;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"tests",(allocator<char> *)&stack0xfffffffffffffe98);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"end_msg",(allocator<char> *)&local_d8);
  pvVar2 = &DAT_00000001;
  prefix.field_2._M_allocated_capacity = in_stack_fffffffffffffe88;
  prefix._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe78._0_8_;
  prefix._M_string_length = in_stack_fffffffffffffe78._8_8_;
  prefix.field_2._8_8_ = in_stack_fffffffffffffe90;
  end_msg._M_string_length._0_1_ = in_stack_fffffffffffffea0;
  end_msg._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe98;
  end_msg._M_string_length._1_7_ = in_stack_fffffffffffffea1;
  end_msg.field_2._M_allocated_capacity = in_stack_fffffffffffffea8;
  end_msg.field_2._8_8_ = in_stack_fffffffffffffeb0;
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>::Timer
            (&micro_timer,prefix,end_msg,(LogFlags)local_98,SUB81(local_b8,0));
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_98);
  result_prefix._M_len = 0xc;
  result_prefix._M_str = "tests: msg (";
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp";
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x53;
  file.m_begin = (iterator)&local_138;
  msg.m_end = in_R9;
  msg.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_148,msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"msg",(allocator<char> *)&stack0xfffffffffffffe87);
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>::LogMsg
            (&local_f8,&micro_timer,&local_118);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_d8,&local_f8,0,0xc);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>>
            (&stack0xfffffffffffffe98,&stack0xfffffffffffffe88,0x53,1,2,&local_d8,
             "micro_timer.LogMsg(\"msg\").substr(0, result_prefix.size())",&result_prefix,
             "result_prefix");
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>::~Timer(&micro_timer);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(logging_timer)
{
    auto micro_timer = BCLog::Timer<std::chrono::microseconds>("tests", "end_msg");
    const std::string_view result_prefix{"tests: msg ("};
    BOOST_CHECK_EQUAL(micro_timer.LogMsg("msg").substr(0, result_prefix.size()), result_prefix);
}